

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_xml_generator.cc
# Opt level: O0

void __thiscall t_xml_generator::generate_struct(t_xml_generator *this,t_struct *tstruct)

{
  bool bVar1;
  byte bVar2;
  string *psVar3;
  members_type *__x;
  reference pptVar4;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_148;
  t_field **local_118;
  allocator local_109;
  string local_108;
  __normal_iterator<t_field_**,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_e8;
  t_field **local_e0;
  __normal_iterator<t_field_**,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_d8;
  iterator mem_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> members;
  allocator local_91;
  string local_90;
  string local_70;
  allocator local_39;
  string local_38 [8];
  string tagname;
  t_struct *tstruct_local;
  t_xml_generator *this_local;
  
  tagname.field_2._8_8_ = tstruct;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"struct",&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  bVar1 = t_struct::is_union((t_struct *)tagname.field_2._8_8_);
  if (bVar1) {
    std::__cxx11::string::operator=(local_38,"union");
  }
  else {
    bVar2 = (**(code **)(*(long *)tagname.field_2._8_8_ + 0x60))();
    if ((bVar2 & 1) != 0) {
      std::__cxx11::string::operator=(local_38,"exception");
    }
  }
  std::__cxx11::string::string((string *)&local_70,local_38);
  write_element_start(this,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_90,"name",&local_91);
  psVar3 = (string *)(**(code **)(*(long *)tagname.field_2._8_8_ + 0x18))();
  std::__cxx11::string::string
            ((string *)
             &members.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,psVar3);
  write_attribute(this,&local_90,
                  (string *)
                  &members.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string
            ((string *)
             &members.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  write_doc(this,(t_doc *)tagname.field_2._8_8_);
  __x = t_struct::get_members((t_struct *)tagname.field_2._8_8_);
  std::vector<t_field_*,_std::allocator<t_field_*>_>::vector
            ((vector<t_field_*,_std::allocator<t_field_*>_> *)&mem_iter,__x);
  __gnu_cxx::__normal_iterator<t_field_**,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
  __normal_iterator(&local_d8);
  local_e0 = (t_field **)
             std::vector<t_field_*,_std::allocator<t_field_*>_>::begin
                       ((vector<t_field_*,_std::allocator<t_field_*>_> *)&mem_iter);
  local_d8._M_current = local_e0;
  while( true ) {
    local_e8._M_current =
         (t_field **)
         std::vector<t_field_*,_std::allocator<t_field_*>_>::end
                   ((vector<t_field_*,_std::allocator<t_field_*>_> *)&mem_iter);
    bVar1 = __gnu_cxx::operator!=(&local_d8,&local_e8);
    if (!bVar1) break;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_108,"field",&local_109);
    write_element_start(this,&local_108);
    std::__cxx11::string::~string((string *)&local_108);
    std::allocator<char>::~allocator((allocator<char> *)&local_109);
    pptVar4 = __gnu_cxx::
              __normal_iterator<t_field_**,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
              operator*(&local_d8);
    generate_field(this,*pptVar4);
    write_element_end(this);
    local_118 = (t_field **)
                __gnu_cxx::
                __normal_iterator<t_field_**,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
                operator++(&local_d8,0);
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&local_148,
        (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)(tagname.field_2._8_8_ + 0x30));
  generate_annotations(this,&local_148);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map(&local_148);
  write_element_end(this);
  std::vector<t_field_*,_std::allocator<t_field_*>_>::~vector
            ((vector<t_field_*,_std::allocator<t_field_*>_> *)&mem_iter);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void t_xml_generator::generate_struct(t_struct* tstruct) {

  string tagname = "struct";
  if (tstruct->is_union()) {
    tagname = "union";
  } else if (tstruct->is_xception()) {
    tagname = "exception";
  }

  write_element_start(tagname);
  write_attribute("name", tstruct->get_name());
  write_doc(tstruct);
  vector<t_field*> members = tstruct->get_members();
  vector<t_field*>::iterator mem_iter;
  for (mem_iter = members.begin(); mem_iter != members.end(); mem_iter++) {
    write_element_start("field");
    generate_field(*mem_iter);
    write_element_end();
  }

  generate_annotations(tstruct->annotations_);

  write_element_end();

}